

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_pushdown.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  int iVar1;
  pointer pLVar2;
  pointer pLVar3;
  reference pvVar4;
  type pLVar5;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  vector<unsigned_long,_true> right_projection_map;
  vector<unsigned_long,_true> left_projection_map;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  right_bindings;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  left_bindings;
  
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  iVar1 = (*pLVar2->_vptr_LogicalOperator[0xc])(pLVar2);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&left_projection_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar2[1].type);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&right_projection_map.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &pLVar2[1].children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  left_bindings._M_h._M_buckets = &left_bindings._M_h._M_single_bucket;
  left_bindings._M_h._M_bucket_count = 1;
  left_bindings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  left_bindings._M_h._M_element_count = 0;
  left_bindings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  left_bindings._M_h._M_rehash_policy._M_next_resize = 0;
  left_bindings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  right_bindings._M_h._M_buckets = &right_bindings._M_h._M_single_bucket;
  right_bindings._M_h._M_bucket_count = 1;
  right_bindings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  right_bindings._M_h._M_element_count = 0;
  right_bindings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  right_bindings._M_h._M_rehash_policy._M_next_resize = 0;
  right_bindings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar3->children,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar4);
  LogicalJoin::GetTableReferences(pLVar5,&left_bindings);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar3->children,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar4);
  LogicalJoin::GetTableReferences(pLVar5,&right_bindings);
  local_110._8_8_ = (ClientContext *)0x0;
  switch(pLVar2->field_0x61) {
  case 1:
    local_e8._8_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownLeftJoin((FilterPushdown *)local_110,op,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)(local_e8 + 8),&left_bindings);
    local_110._8_8_ = local_110._0_8_;
    local_110._0_8_ = (ClientContext *)0x0;
    if ((LogicalOperator *)local_e8._8_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_e8._8_8_)[1])();
    }
    local_e8._8_8_ = 0;
    break;
  default:
    local_110._16_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown(this,op);
    if ((LogicalOperator *)local_110._16_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_110._16_8_)[1])();
    }
    local_110._16_8_ = (pointer)0x0;
    goto LAB_01258b47;
  case 3:
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    if (pLVar2->type == LOGICAL_ASOF_JOIN) {
      local_d8._8_8_ =
           (in_RDX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RDX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      PushdownLeftJoin((FilterPushdown *)local_110,op,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)(local_d8 + 8),&left_bindings);
      local_110._8_8_ = local_110._0_8_;
      local_110._0_8_ = (ClientContext *)0x0;
      if ((LogicalOperator *)local_d8._8_8_ != (LogicalOperator *)0x0) {
        (*(*(_func_int ***)local_d8._8_8_)[1])();
      }
      local_d8._8_8_ = 0;
    }
    else {
      local_d8._0_8_ =
           (in_RDX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RDX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      PushdownInnerJoin((FilterPushdown *)local_110,op,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_d8,&left_bindings);
      local_110._8_8_ = local_110._0_8_;
      local_110._0_8_ = (ClientContext *)0x0;
      if ((LogicalOperator *)local_d8._0_8_ != (LogicalOperator *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_d8._0_8_)[1]._M_nxt)();
      }
      local_d8._0_8_ = (_Hash_node_base *)0x0;
    }
    break;
  case 5:
  case 6:
    local_110._24_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownSemiAntiJoin((FilterPushdown *)local_110,op);
    local_110._8_8_ = local_110._0_8_;
    local_110._0_8_ = (ClientContext *)0x0;
    if ((LogicalOperator *)local_110._24_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_110._24_8_)[1])();
    }
    local_110._24_8_ = (pointer)0x0;
    break;
  case 7:
    local_e8._0_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownMarkJoin((FilterPushdown *)local_110,op,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_e8,&left_bindings);
    local_110._8_8_ = local_110._0_8_;
    local_110._0_8_ = (ClientContext *)0x0;
    if ((LogicalOperator *)local_e8._0_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_e8._0_8_)[1])();
    }
    local_e8._0_8_ = (__buckets_ptr)0x0;
    break;
  case 8:
    local_110._32_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownSingleJoin((FilterPushdown *)local_110,op,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)(local_110 + 0x20),&left_bindings);
    local_110._8_8_ = local_110._0_8_;
    local_110._0_8_ = (ClientContext *)0x0;
    if ((LogicalOperator *)local_110._32_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_110._32_8_)[1])();
    }
    local_110._32_8_ = (pointer)0x0;
  }
  if ((char)iVar1 != '\0') {
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)(local_110 + 8));
    if (((ulong)pLVar2->type < 0x39) &&
       ((0x138000000000000U >> ((ulong)pLVar2->type & 0x3f) & 1) != 0)) {
      pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)(local_110 + 8));
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar2[1].type,
                 &left_projection_map);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &pLVar2[1].children.
                  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&right_projection_map);
    }
  }
  this->optimizer = (Optimizer *)local_110._8_8_;
LAB_01258b47:
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&right_bindings._M_h);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&left_bindings._M_h);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&right_projection_map);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&left_projection_map);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownJoin(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN ||
	         op->type == LogicalOperatorType::LOGICAL_ASOF_JOIN || op->type == LogicalOperatorType::LOGICAL_ANY_JOIN ||
	         op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN);
	auto &join = op->Cast<LogicalJoin>();

	const auto restore_projection_maps = join.HasProjectionMap();
	auto left_projection_map = join.left_projection_map;
	auto right_projection_map = join.right_projection_map;

	unordered_set<idx_t> left_bindings, right_bindings;
	LogicalJoin::GetTableReferences(*op->children[0], left_bindings);
	LogicalJoin::GetTableReferences(*op->children[1], right_bindings);

	unique_ptr<LogicalOperator> result;
	switch (join.join_type) {
	case JoinType::INNER:
		//	AsOf joins can't push anything into the RHS, so treat it as a left join
		if (op->type == LogicalOperatorType::LOGICAL_ASOF_JOIN) {
			result = PushdownLeftJoin(std::move(op), left_bindings, right_bindings);
			break;
		}
		result = PushdownInnerJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::LEFT:
		result = PushdownLeftJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::MARK:
		result = PushdownMarkJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::SINGLE:
		result = PushdownSingleJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::SEMI:
	case JoinType::ANTI:
		result = PushdownSemiAntiJoin(std::move(op));
		break;
	default:
		// unsupported join type: stop pushing down
		return FinishPushdown(std::move(op));
	}

	if (restore_projection_maps) {
		switch (result->type) {
		case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		case LogicalOperatorType::LOGICAL_ANY_JOIN:
		case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
			// Pushing down filter through join didn't change operator type (e.g., LogicalEmptyResult), restore maps
			auto &result_join = result->Cast<LogicalJoin>();
			result_join.left_projection_map = std::move(left_projection_map);
			result_join.right_projection_map = std::move(right_projection_map);
			break;
		}
		default:
			break;
		}
	}
	return result;
}